

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

Tensor<std::complex<double>_> * __thiscall
scp::Tensor<std::complex<double>>::operator/=
          (Tensor<std::complex<double>> *this,complex<double> *scalar)

{
  long lVar1;
  complex<double> *this_00;
  
  this_00 = *(complex<double> **)(this + 0x20);
  for (lVar1 = *(long *)(this + 0x18) << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    std::complex<double>::operator/=(this_00,scalar);
    this_00 = this_00 + 1;
  }
  return (Tensor<std::complex<double>_> *)this;
}

Assistant:

constexpr Tensor<TValue>& Tensor<TValue>::operator/=(const TScalar& scalar)
	{
		TValue* values = _values;
		const TValue* const valuesEnd = _values + _length;

		for (; values != valuesEnd; ++values)
		{
			*values /= scalar;
		}

		return *this;
	}